

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O1

void __thiscall
slang::ast::RecursiveStructMemberIterator::prepNext(RecursiveStructMemberIterator *this)

{
  FieldIt *pFVar1;
  size_t *psVar2;
  FieldSymbol **ppFVar3;
  SyntaxNode *pSVar4;
  Type *pTVar5;
  size_type sVar6;
  pointer pSVar7;
  Type *pTVar8;
  ConstantValue *pCVar9;
  
  while( true ) {
    while (ppFVar3 = (this->curr).fieldIt._M_current, ppFVar3 == (this->curr).fieldEnd._M_current) {
      sVar6 = (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.
              len;
      if (sVar6 == 0) {
        (this->curr).type = (Type *)0x0;
        return;
      }
      pSVar7 = (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>
               .data_;
      pCVar9 = pSVar7[sVar6 - 1].val;
      pTVar8 = pSVar7[sVar6 - 1].type;
      ppFVar3 = ((FieldIt *)(&pSVar7[sVar6 - 1].valIndex + 1))->_M_current;
      (this->curr).valIndex = pSVar7[sVar6 - 1].valIndex;
      (this->curr).fieldIt._M_current = ppFVar3;
      (this->curr).val = pCVar9;
      (this->curr).type = pTVar8;
      (this->curr).fieldEnd._M_current = pSVar7[sVar6 - 1].fieldEnd._M_current;
      (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.len =
           sVar6 - 1;
      pFVar1 = &(this->curr).fieldIt;
      pFVar1->_M_current = pFVar1->_M_current + 1;
      psVar2 = &(this->curr).valIndex;
      *psVar2 = *psVar2 + 1;
    }
    pTVar8 = DeclaredType::getType
                       (&((*ppFVar3)->super_VariableSymbol).super_ValueSymbol.declaredType);
    if (pTVar8->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar8);
    }
    if ((pTVar8->canonical->super_Symbol).kind != UnpackedStructType) break;
    SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>::
    emplace_back<slang::ast::RecursiveStructMemberIterator::State&>
              (&(this->stack).
                super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>,&this->curr)
    ;
    if (pTVar8->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar8);
    }
    pSVar4 = pTVar8->canonical[1].super_Symbol.originatingSyntax;
    pTVar5 = pTVar8->canonical[1].canonical;
    (this->curr).type = pTVar8;
    pCVar9 = ConstantValue::at((this->curr).val,(this->curr).valIndex);
    (this->curr).val = pCVar9;
    (this->curr).fieldIt._M_current = (FieldSymbol **)pSVar4;
    (this->curr).fieldEnd._M_current = (FieldSymbol **)(&pSVar4->kind + (long)pTVar5 * 2);
    (this->curr).valIndex = 0;
  }
  return;
}

Assistant:

void prepNext() {
        if (curr.fieldIt == curr.fieldEnd) {
            if (stack.empty()) {
                curr.type = nullptr;
                return;
            }

            curr = stack.back();
            stack.pop_back();

            curr.next();
            prepNext();
        }
        else {
            auto& type = (*curr.fieldIt)->getType();
            if (type.isUnpackedStruct()) {
                stack.emplace_back(curr);

                auto fields = type.getCanonicalType().as<UnpackedStructType>().fields;
                curr.type = &type;
                curr.val = &curr.val->at(curr.valIndex);
                curr.fieldIt = fields.begin();
                curr.fieldEnd = fields.end();
                curr.valIndex = 0;
                prepNext();
            }
        }
    }